

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

void __thiscall Database::Database(Database *this)

{
  pointer __p;
  Database *this_local;
  
  __p = (pointer)operator_new(8);
  std::unique_ptr<Database::impl_,std::default_delete<Database::impl_>>::
  unique_ptr<std::default_delete<Database::impl_>,void>
            ((unique_ptr<Database::impl_,std::default_delete<Database::impl_>> *)this,__p);
  this->connected = false;
  this->engine = MySQL;
  std::__cxx11::string::string((string *)&this->host);
  std::__cxx11::string::string((string *)&this->user);
  std::__cxx11::string::string((string *)&this->pass);
  std::__cxx11::string::string((string *)&this->db);
  this->in_transaction = false;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(&this->transaction_log);
  Database_Result::Database_Result(&this->callbackdata);
  return;
}

Assistant:

Database::Database()
	: impl(new impl_)
	, connected(false)
	, engine(Engine(0))
	, in_transaction(false)
{ }